

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

void __thiscall
cnn::Conv1DNarrow::backward_impl
          (Conv1DNarrow *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  const_reference ppTVar6;
  Scalar *pSVar7;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  long in_RDI;
  uint in_R8D;
  uint k_1;
  uint j_1;
  uint i_2;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  uint k;
  uint j;
  uint i_1;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> f;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> di;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> d;
  uint fcols;
  uint ycols;
  uint rows;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff28;
  uint uVar9;
  undefined4 in_stack_ffffffffffffff2c;
  uint uVar10;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *in_stack_ffffffffffffff30;
  Tensor *in_stack_ffffffffffffff38;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  
  if (1 < in_R8D) {
    __assert_fail("i < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/conv.cc"
                  ,0x9e,
                  "virtual void cnn::Conv1DNarrow::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  ppTVar6 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  uVar3 = Dim::rows(&(*ppTVar6)->d);
  uVar4 = Dim::cols((Dim *)(in_RDI + 0x20));
  ppTVar6 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,1);
  uVar5 = Dim::cols(&(*ppTVar6)->d);
  Tensor::operator*(in_stack_ffffffffffffff38);
  Tensor::operator*(in_stack_ffffffffffffff38);
  if (in_R8D == 0) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,1);
    Tensor::operator*(in_stack_ffffffffffffff38);
    for (local_a4 = 0; local_a4 < uVar3; local_a4 = local_a4 + 1) {
      for (local_a8 = 0; local_a8 < uVar4; local_a8 = local_a8 + 1) {
        for (local_ac = 0; local_ac < uVar5; local_ac = local_ac + 1) {
          pSVar7 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()(in_stack_ffffffffffffff30,
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          fVar1 = *pSVar7;
          pSVar7 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()(in_stack_ffffffffffffff30,
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          fVar2 = *pSVar7;
          pSVar7 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()(in_stack_ffffffffffffff30,
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          *pSVar7 = fVar1 * fVar2 + *pSVar7;
        }
      }
    }
  }
  else {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
    Tensor::operator*(in_stack_ffffffffffffff38);
    for (uVar10 = 0; uVar10 < uVar3; uVar10 = uVar10 + 1) {
      for (uVar9 = 0; uVar9 < uVar4; uVar9 = uVar9 + 1) {
        for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 1) {
          pSVar7 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()(in_stack_ffffffffffffff30,CONCAT44(uVar10,uVar9),
                                CONCAT44(uVar8,in_stack_ffffffffffffff20));
          fVar1 = *pSVar7;
          pSVar7 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()(in_stack_ffffffffffffff30,CONCAT44(uVar10,uVar9),
                                CONCAT44(uVar8,in_stack_ffffffffffffff20));
          fVar2 = *pSVar7;
          pSVar7 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()(in_stack_ffffffffffffff30,CONCAT44(uVar10,uVar9),
                                CONCAT44(uVar8,in_stack_ffffffffffffff20));
          *pSVar7 = fVar1 * fVar2 + *pSVar7;
        }
      }
    }
  }
  return;
}

Assistant:

void Conv1DNarrow::backward_impl(const vector<const Tensor*>& xs,
                            const Tensor& fx,
                            const Tensor& dEdf,
                            unsigned i,
                            Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Conv1DNarrow::backward not implemented for CUDA");
#else
  // TODO this is a bad implementation- rewrite to use unsupported Eigen tensor library
  assert(i < 2);
  const unsigned rows = xs[0]->d.rows();
  const unsigned ycols = dim.cols();
  const unsigned fcols = xs[1]->d.cols();
  auto d = *dEdf;
  auto di = *dEdxi;
  if (i == 0) { // derivative wrt input x
    auto f = **xs[1];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < ycols; ++j) {
        for (unsigned k = 0; k < fcols; ++k)
          di(i, j + k) += f(i, k) * d(i, j);
      }
    }
  } else { // derivative wrt filter f
    auto x = **xs[0];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < ycols; ++j) {
        for (unsigned k = 0; k < fcols; ++k)
          di(i, k) += x(i, j + k) * d(i, j);
      }
    }
  }
#endif
}